

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateConvolutionLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  RepeatedField<unsigned_long> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  string *layerName;
  bool bVar4;
  WeightParamType WVar5;
  LayerUnion LVar6;
  undefined8 *puVar7;
  unsigned_long *puVar8;
  uint64 uVar9;
  long *plVar10;
  size_type *psVar11;
  unsigned_long uVar12;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  WeightParams *pWVar15;
  unsigned_long __val;
  string err_1;
  string err;
  Result r;
  string local_2d0;
  undefined1 local_2b0 [8];
  _Alloc_hider local_2a8;
  undefined1 local_2a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  _Alloc_hider local_280;
  size_type local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  WeightParamType local_23c;
  uint64 local_238;
  unsigned_long local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string *local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  void *local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  ulong local_138;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  Result::Result((Result *)&local_288);
  validateInputCount((Result *)local_2b0,layer,1,2);
  local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0;
  std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2a8);
  if (local_2a8._M_p != local_2a0 + 8) {
    operator_delete(local_2a8._M_p,local_2a0._8_8_ + 1);
  }
  bVar4 = Result::good((Result *)&local_288);
  if (bVar4) {
    validateOutputCount((Result *)local_2b0,layer,1,1);
    local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0;
    std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2a8);
    if (local_2a8._M_p != local_2a0 + 8) {
      operator_delete(local_2a8._M_p,local_2a0._8_8_ + 1);
    }
    bVar4 = Result::good((Result *)&local_288);
    if (bVar4) {
      if (this->ndArrayInterpretation != true) {
        if ((layer->input_).super_RepeatedPtrFieldBase.current_size_ == 1) {
LAB_0051ebec:
          if (layer->_oneof_case_[0] == 100) {
            LVar6 = layer->layer_;
          }
          else {
            LVar6.convolution_ = Specification::ConvolutionLayerParams::default_instance();
          }
          if ((LVar6.convolution_)->_oneof_case_[0] != 0) {
            if (layer->_oneof_case_[0] == 100) {
              LVar6 = layer->layer_;
            }
            else {
              LVar6.convolution_ = Specification::ConvolutionLayerParams::default_instance();
            }
            bVar4 = (LVar6.convolution_)->isdeconvolution_;
            iVar3 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
            if ((iVar3 != 1 & bVar4) != 1) {
              if ((iVar3 != 1) && (0 < ((LVar6.convolution_)->dilationfactor_).current_size_)) {
                this_00 = &(LVar6.convolution_)->dilationfactor_;
                puVar8 = google::protobuf::RepeatedField<unsigned_long>::Get(this_00,0);
                if ((1 < *puVar8) ||
                   ((1 < this_00->current_size_ &&
                    (puVar8 = google::protobuf::RepeatedField<unsigned_long>::Get(this_00,1),
                    1 < *puVar8)))) {
                  std::operator+(&local_2d0,"Convolution layer: \'",(layer->name_).ptr_);
                  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
                  local_2b0 = (undefined1  [8])local_2a0;
                  psVar11 = puVar7 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar11) {
                    local_2a0._0_8_ = *psVar11;
                    local_2a0._8_8_ = puVar7[3];
                  }
                  else {
                    local_2a0._0_8_ = *psVar11;
                    local_2b0 = (undefined1  [8])*puVar7;
                  }
                  local_2a8._M_p = (pointer)puVar7[1];
                  *puVar7 = psVar11;
                  puVar7[1] = 0;
                  *(undefined1 *)(puVar7 + 2) = 0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                    operator_delete(local_2d0._M_dataplus._M_p,
                                    local_2d0.field_2._M_allocated_capacity + 1);
                  }
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_2b0
                                );
                  goto LAB_0051ef48;
                }
              }
              local_208 = (string *)(LVar6.convolution_)->kernelchannels_;
              local_138 = (LVar6.convolution_)->ngroups_ +
                          (ulong)((LVar6.convolution_)->ngroups_ == 0);
              local_238 = (LVar6.convolution_)->outputchannels_;
              iVar3 = ((LVar6.convolution_)->kernelsize_).current_size_;
              local_230 = 3;
              if (iVar3 < 1) {
                local_1a0 = (void *)0x3;
              }
              else {
                local_1a0 = ((LVar6.innerproduct_)->bias_->_internal_metadata_).
                            super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                            .ptr_;
                if (iVar3 != 1) {
                  puVar8 = google::protobuf::RepeatedField<unsigned_long>::Get
                                     (&(LVar6.convolution_)->kernelsize_,1);
                  local_230 = *puVar8;
                }
              }
              iVar3 = (layer->input_).super_RepeatedPtrFieldBase.current_size_;
              if (1 < iVar3) goto LAB_0051f015;
              bVar2 = (LVar6.convolution_)->hasbias_;
              if ((iVar3 != 1) && (bVar2 != false)) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_2b0,"Convolution layer: \'",(layer->name_).ptr_);
                puVar7 = (undefined8 *)std::__cxx11::string::append(local_2b0);
                local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                psVar11 = puVar7 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar11) {
                  local_2d0.field_2._M_allocated_capacity = *psVar11;
                  local_2d0.field_2._8_8_ = puVar7[3];
                }
                else {
                  local_2d0.field_2._M_allocated_capacity = *psVar11;
                  local_2d0._M_dataplus._M_p = (pointer)*puVar7;
                }
                local_2d0._M_string_length = puVar7[1];
                *puVar7 = psVar11;
                puVar7[1] = 0;
                *(undefined1 *)(puVar7 + 2) = 0;
                if (local_2b0 != (undefined1  [8])local_2a0) {
                  operator_delete((void *)local_2b0,local_2a0._0_8_ + 1);
                }
                Result::Result((Result *)local_2b0,INVALID_MODEL_PARAMETERS,&local_2d0);
                local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2b0;
                std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2a8);
                if (local_2a8._M_p != local_2a0 + 8) {
                  operator_delete(local_2a8._M_p,local_2a0._8_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                  operator_delete(local_2d0._M_dataplus._M_p,
                                  local_2d0.field_2._M_allocated_capacity + 1);
                }
              }
              pWVar15 = (LVar6.convolution_)->weights_;
              if (pWVar15 == (WeightParams *)0x0) {
                pWVar15 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              WVar5 = valueType(pWVar15);
              pWVar15 = (LVar6.convolution_)->bias_;
              if (pWVar15 == (WeightParams *)0x0) {
                pWVar15 = (WeightParams *)&Specification::_WeightParams_default_instance_;
              }
              local_23c = valueType(pWVar15);
              if ((WVar5 == UNSPECIFIED) || ((local_23c == UNSPECIFIED & bVar2) != 0)) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_2b0,"Convolution layer \'",(layer->name_).ptr_);
                puVar7 = (undefined8 *)std::__cxx11::string::append(local_2b0);
                local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                psVar11 = puVar7 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar11) {
                  local_2d0.field_2._M_allocated_capacity = *psVar11;
                  local_2d0.field_2._8_8_ = puVar7[3];
                }
                else {
                  local_2d0.field_2._M_allocated_capacity = *psVar11;
                  local_2d0._M_dataplus._M_p = (pointer)*puVar7;
                }
                local_2d0._M_string_length = puVar7[1];
                *puVar7 = psVar11;
                puVar7[1] = 0;
                *(undefined1 *)(puVar7 + 2) = 0;
                if (local_2b0 != (undefined1  [8])local_2a0) {
                  operator_delete((void *)local_2b0,local_2a0._0_8_ + 1);
                }
                Result::Result((Result *)local_2b0,INVALID_MODEL_PARAMETERS,&local_2d0);
                goto LAB_0051ee66;
              }
              if ((bVar2 == false) ||
                 (((WVar5 != FLOAT16 || (local_23c != FLOAT32)) &&
                  ((WVar5 != FLOAT32 || (local_23c != FLOAT16)))))) {
                uVar9 = local_238;
                if (bVar4 != false) {
                  uVar9 = local_238 / local_138;
                }
                uVar12 = local_230 * (long)local_1a0 * uVar9 * (long)local_208;
                if (WVar5 < QUINT) {
                  pWVar15 = (LVar6.convolution_)->weights_;
                  if (pWVar15 == (WeightParams *)0x0) {
                    pWVar15 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                  }
                  if (WVar5 == FLOAT32) {
                    __val = (unsigned_long)(pWVar15->floatvalue_).current_size_;
                  }
                  else {
                    __val = ((pWVar15->float16value_).ptr_)->_M_string_length >> 1;
                  }
                  if (__val == uVar12) goto LAB_0051f5b9;
                  if (bVar4 != false) {
                    std::operator+(&local_90,"Deconvolution layer \'",(layer->name_).ptr_);
                    plVar10 = (long *)std::__cxx11::string::append((char *)&local_90);
                    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                    psVar11 = (size_type *)(plVar10 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar10 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar11) {
                      local_1e0.field_2._M_allocated_capacity = *psVar11;
                      local_1e0.field_2._8_8_ = plVar10[3];
                    }
                    else {
                      local_1e0.field_2._M_allocated_capacity = *psVar11;
                      local_1e0._M_dataplus._M_p = (pointer)*plVar10;
                    }
                    local_1e0._M_string_length = plVar10[1];
                    *plVar10 = (long)psVar11;
                    plVar10[1] = 0;
                    *(undefined1 *)(plVar10 + 2) = 0;
                    std::__cxx11::to_string(&local_b0,__val);
                    std::operator+(&local_70,&local_1e0,&local_b0);
                    plVar10 = (long *)std::__cxx11::string::append((char *)&local_70);
                    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                    psVar11 = (size_type *)(plVar10 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar10 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar11) {
                      local_1c0.field_2._M_allocated_capacity = *psVar11;
                      local_1c0.field_2._8_8_ = plVar10[3];
                    }
                    else {
                      local_1c0.field_2._M_allocated_capacity = *psVar11;
                      local_1c0._M_dataplus._M_p = (pointer)*plVar10;
                    }
                    local_1c0._M_string_length = plVar10[1];
                    *plVar10 = (long)psVar11;
                    plVar10[1] = 0;
                    *(undefined1 *)(plVar10 + 2) = 0;
                    std::__cxx11::to_string(&local_d0,(unsigned_long)local_208);
                    std::operator+(&local_198,&local_1c0,&local_d0);
                    plVar10 = (long *)std::__cxx11::string::append((char *)&local_198);
                    psVar11 = (size_type *)(plVar10 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar10 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar11) {
                      local_200.field_2._M_allocated_capacity = *psVar11;
                      local_200.field_2._8_8_ = plVar10[3];
                      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
                    }
                    else {
                      local_200.field_2._M_allocated_capacity = *psVar11;
                      local_200._M_dataplus._M_p = (pointer)*plVar10;
                    }
                    local_200._M_string_length = plVar10[1];
                    *plVar10 = (long)psVar11;
                    plVar10[1] = 0;
                    *(undefined1 *)(plVar10 + 2) = 0;
                    std::__cxx11::to_string(&local_f0,local_238 / local_138);
                    std::operator+(&local_178,&local_200,&local_f0);
                    plVar10 = (long *)std::__cxx11::string::append((char *)&local_178);
                    psVar11 = (size_type *)(plVar10 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar10 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar11) {
                      local_228.field_2._M_allocated_capacity = *psVar11;
                      local_228.field_2._8_8_ = plVar10[3];
                      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                    }
                    else {
                      local_228.field_2._M_allocated_capacity = *psVar11;
                      local_228._M_dataplus._M_p = (pointer)*plVar10;
                    }
                    local_228._M_string_length = plVar10[1];
                    *plVar10 = (long)psVar11;
                    plVar10[1] = 0;
                    *(undefined1 *)(plVar10 + 2) = 0;
                    std::__cxx11::to_string(&local_110,(unsigned_long)local_1a0);
                    std::operator+(&local_158,&local_228,&local_110);
                    plVar10 = (long *)std::__cxx11::string::append((char *)&local_158);
                    psVar11 = (size_type *)(plVar10 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar10 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar11) {
                      local_260.field_2._M_allocated_capacity = *psVar11;
                      local_260.field_2._8_8_ = plVar10[3];
                      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                    }
                    else {
                      local_260.field_2._M_allocated_capacity = *psVar11;
                      local_260._M_dataplus._M_p = (pointer)*plVar10;
                    }
                    local_260._M_string_length = plVar10[1];
                    *plVar10 = (long)psVar11;
                    plVar10[1] = 0;
                    *(undefined1 *)(plVar10 + 2) = 0;
                    std::__cxx11::to_string(&local_130,local_230);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_2b0,&local_260,&local_130);
                    puVar7 = (undefined8 *)std::__cxx11::string::append(local_2b0);
                    psVar11 = puVar7 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar7 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar11) {
                      local_2d0.field_2._M_allocated_capacity = *psVar11;
                      local_2d0.field_2._8_8_ = puVar7[3];
                      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                    }
                    else {
                      local_2d0.field_2._M_allocated_capacity = *psVar11;
                      local_2d0._M_dataplus._M_p = (pointer)*puVar7;
                    }
                    local_2d0._M_string_length = puVar7[1];
                    *puVar7 = psVar11;
                    puVar7[1] = 0;
                    *(undefined1 *)(puVar7 + 2) = 0;
                    if (local_2b0 != (undefined1  [8])local_2a0) {
                      operator_delete((void *)local_2b0,local_2a0._0_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_130._M_dataplus._M_p != &local_130.field_2) {
                      operator_delete(local_130._M_dataplus._M_p,
                                      local_130.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_260._M_dataplus._M_p != &local_260.field_2) {
                      operator_delete(local_260._M_dataplus._M_p,
                                      local_260.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_158._M_dataplus._M_p != &local_158.field_2) {
                      operator_delete(local_158._M_dataplus._M_p,
                                      local_158.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_110._M_dataplus._M_p != &local_110.field_2) {
                      operator_delete(local_110._M_dataplus._M_p,
                                      local_110.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_228._M_dataplus._M_p != &local_228.field_2) {
                      operator_delete(local_228._M_dataplus._M_p,
                                      local_228.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_178._M_dataplus._M_p != &local_178.field_2) {
                      operator_delete(local_178._M_dataplus._M_p,
                                      local_178.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                      operator_delete(local_f0._M_dataplus._M_p,
                                      local_f0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_200._M_dataplus._M_p != &local_200.field_2) {
                      operator_delete(local_200._M_dataplus._M_p,
                                      local_200.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_198._M_dataplus._M_p != &local_198.field_2) {
                      operator_delete(local_198._M_dataplus._M_p,
                                      local_198.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                      operator_delete(local_d0._M_dataplus._M_p,
                                      local_d0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                      operator_delete(local_1c0._M_dataplus._M_p,
                                      local_1c0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_70._M_dataplus._M_p != &local_70.field_2) {
                      operator_delete(local_70._M_dataplus._M_p,
                                      local_70.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                      operator_delete(local_b0._M_dataplus._M_p,
                                      local_b0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                      operator_delete(local_1e0._M_dataplus._M_p,
                                      local_1e0.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_90._M_dataplus._M_p != &local_90.field_2) {
                      operator_delete(local_90._M_dataplus._M_p,
                                      local_90.field_2._M_allocated_capacity + 1);
                    }
                    Result::Result((Result *)local_2b0,INVALID_MODEL_PARAMETERS,&local_2d0);
                    local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_2b0;
                    std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2a8);
                    if (local_2a8._M_p != local_2a0 + 8) {
                      operator_delete(local_2a8._M_p,local_2a0._8_8_ + 1);
                    }
                    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      **)__return_storage_ptr__ = local_288;
                    paVar1 = &(__return_storage_ptr__->m_message).field_2;
                    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_280._M_p == &local_270) {
                      paVar1->_M_allocated_capacity =
                           CONCAT71(local_270._M_allocated_capacity._1_7_,local_270._M_local_buf[0])
                      ;
                      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
                           local_270._8_8_;
                    }
                    else {
                      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_280._M_p;
                      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
                           CONCAT71(local_270._M_allocated_capacity._1_7_,local_270._M_local_buf[0])
                      ;
                    }
                    (__return_storage_ptr__->m_message)._M_string_length = local_278;
                    local_278 = 0;
                    local_270._M_local_buf[0] = '\0';
                    local_280._M_p = (pointer)&local_270;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p == &local_2d0.field_2) goto LAB_0051f063;
                    goto LAB_0051eef5;
                  }
                  std::operator+(&local_90,"Convolution layer \'",(layer->name_).ptr_);
                  plVar10 = (long *)std::__cxx11::string::append((char *)&local_90);
                  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                  psVar11 = (size_type *)(plVar10 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar10 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar11) {
                    local_1e0.field_2._M_allocated_capacity = *psVar11;
                    local_1e0.field_2._8_8_ = plVar10[3];
                  }
                  else {
                    local_1e0.field_2._M_allocated_capacity = *psVar11;
                    local_1e0._M_dataplus._M_p = (pointer)*plVar10;
                  }
                  local_1e0._M_string_length = plVar10[1];
                  *plVar10 = (long)psVar11;
                  plVar10[1] = 0;
                  *(undefined1 *)(plVar10 + 2) = 0;
                  std::__cxx11::to_string(&local_b0,__val);
                  std::operator+(&local_70,&local_1e0,&local_b0);
                  plVar10 = (long *)std::__cxx11::string::append((char *)&local_70);
                  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                  psVar11 = (size_type *)(plVar10 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar10 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar11) {
                    local_1c0.field_2._M_allocated_capacity = *psVar11;
                    local_1c0.field_2._8_8_ = plVar10[3];
                  }
                  else {
                    local_1c0.field_2._M_allocated_capacity = *psVar11;
                    local_1c0._M_dataplus._M_p = (pointer)*plVar10;
                  }
                  local_1c0._M_string_length = plVar10[1];
                  *plVar10 = (long)psVar11;
                  plVar10[1] = 0;
                  *(undefined1 *)(plVar10 + 2) = 0;
                  std::__cxx11::to_string(&local_d0,local_238);
                  std::operator+(&local_198,&local_1c0,&local_d0);
                  plVar10 = (long *)std::__cxx11::string::append((char *)&local_198);
                  psVar11 = (size_type *)(plVar10 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar10 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar11) {
                    local_200.field_2._M_allocated_capacity = *psVar11;
                    local_200.field_2._8_8_ = plVar10[3];
                    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
                  }
                  else {
                    local_200.field_2._M_allocated_capacity = *psVar11;
                    local_200._M_dataplus._M_p = (pointer)*plVar10;
                  }
                  local_200._M_string_length = plVar10[1];
                  *plVar10 = (long)psVar11;
                  plVar10[1] = 0;
                  *(undefined1 *)(plVar10 + 2) = 0;
                  std::__cxx11::to_string(&local_f0,(unsigned_long)local_208);
                  std::operator+(&local_178,&local_200,&local_f0);
                  plVar10 = (long *)std::__cxx11::string::append((char *)&local_178);
                  psVar11 = (size_type *)(plVar10 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar10 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar11) {
                    local_228.field_2._M_allocated_capacity = *psVar11;
                    local_228.field_2._8_8_ = plVar10[3];
                    local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                  }
                  else {
                    local_228.field_2._M_allocated_capacity = *psVar11;
                    local_228._M_dataplus._M_p = (pointer)*plVar10;
                  }
                  local_228._M_string_length = plVar10[1];
                  *plVar10 = (long)psVar11;
                  plVar10[1] = 0;
                  *(undefined1 *)(plVar10 + 2) = 0;
                  std::__cxx11::to_string(&local_110,(unsigned_long)local_1a0);
                  std::operator+(&local_158,&local_228,&local_110);
                  plVar10 = (long *)std::__cxx11::string::append((char *)&local_158);
                  psVar11 = (size_type *)(plVar10 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar10 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar11) {
                    local_260.field_2._M_allocated_capacity = *psVar11;
                    local_260.field_2._8_8_ = plVar10[3];
                    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                  }
                  else {
                    local_260.field_2._M_allocated_capacity = *psVar11;
                    local_260._M_dataplus._M_p = (pointer)*plVar10;
                  }
                  local_260._M_string_length = plVar10[1];
                  *plVar10 = (long)psVar11;
                  plVar10[1] = 0;
                  *(undefined1 *)(plVar10 + 2) = 0;
                  std::__cxx11::to_string(&local_130,local_230);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2b0,&local_260,&local_130);
                  puVar7 = (undefined8 *)std::__cxx11::string::append(local_2b0);
                  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                  psVar11 = puVar7 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar11) {
                    local_2d0.field_2._M_allocated_capacity = *psVar11;
                    local_2d0.field_2._8_8_ = puVar7[3];
                  }
                  else {
                    local_2d0.field_2._M_allocated_capacity = *psVar11;
                    local_2d0._M_dataplus._M_p = (pointer)*puVar7;
                  }
                  local_2d0._M_string_length = puVar7[1];
                  *puVar7 = psVar11;
                  puVar7[1] = 0;
                  *(undefined1 *)(puVar7 + 2) = 0;
                  if (local_2b0 != (undefined1  [8])local_2a0) {
                    operator_delete((void *)local_2b0,local_2a0._0_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_130._M_dataplus._M_p != &local_130.field_2) {
                    operator_delete(local_130._M_dataplus._M_p,
                                    local_130.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_260._M_dataplus._M_p != &local_260.field_2) {
                    operator_delete(local_260._M_dataplus._M_p,
                                    local_260.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_158._M_dataplus._M_p != &local_158.field_2) {
                    operator_delete(local_158._M_dataplus._M_p,
                                    local_158.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_110._M_dataplus._M_p != &local_110.field_2) {
                    operator_delete(local_110._M_dataplus._M_p,
                                    local_110.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_228._M_dataplus._M_p != &local_228.field_2) {
                    operator_delete(local_228._M_dataplus._M_p,
                                    local_228.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_178._M_dataplus._M_p != &local_178.field_2) {
                    operator_delete(local_178._M_dataplus._M_p,
                                    local_178.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                    operator_delete(local_f0._M_dataplus._M_p,
                                    local_f0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_200._M_dataplus._M_p != &local_200.field_2) {
                    operator_delete(local_200._M_dataplus._M_p,
                                    local_200.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_198._M_dataplus._M_p != &local_198.field_2) {
                    operator_delete(local_198._M_dataplus._M_p,
                                    local_198.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                    operator_delete(local_d0._M_dataplus._M_p,
                                    local_d0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                    operator_delete(local_1c0._M_dataplus._M_p,
                                    local_1c0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_70._M_dataplus._M_p != &local_70.field_2) {
                    operator_delete(local_70._M_dataplus._M_p,
                                    local_70.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                    operator_delete(local_b0._M_dataplus._M_p,
                                    local_b0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                    operator_delete(local_1e0._M_dataplus._M_p,
                                    local_1e0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_90._M_dataplus._M_p != &local_90.field_2) {
                    operator_delete(local_90._M_dataplus._M_p,
                                    local_90.field_2._M_allocated_capacity + 1);
                  }
                  Result::Result((Result *)local_2b0,INVALID_MODEL_PARAMETERS,&local_2d0);
LAB_005206d8:
                  local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_2b0;
                  std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2a8);
                  if (local_2a8._M_p != local_2a0 + 8) {
                    operator_delete(local_2a8._M_p,local_2a0._8_8_ + 1);
                  }
                  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)__return_storage_ptr__ = local_288;
                  paVar1 = &(__return_storage_ptr__->m_message).field_2;
                  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_280._M_p == &local_270) {
                    paVar1->_M_allocated_capacity =
                         CONCAT71(local_270._M_allocated_capacity._1_7_,local_270._M_local_buf[0]);
                    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
                         local_270._8_8_;
                  }
                  else {
                    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_280._M_p;
                    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
                         CONCAT71(local_270._M_allocated_capacity._1_7_,local_270._M_local_buf[0]);
                  }
                  (__return_storage_ptr__->m_message)._M_string_length = local_278;
                  local_278 = 0;
                  local_270._M_local_buf[0] = '\0';
                  local_280._M_p = (pointer)&local_270;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d0._M_dataplus._M_p == &local_2d0.field_2) goto LAB_0051f063;
                  goto LAB_0051eef5;
                }
                if (WVar5 == QUINT) {
                  pWVar15 = (LVar6.convolution_)->weights_;
                  if (pWVar15 == (WeightParams *)0x0) {
                    pWVar15 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                  }
                  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                  local_230 = uVar12;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_2d0,"Convolution","");
                  local_208 = (layer->name_).ptr_;
                  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"weight","");
                  validateGeneralWeightParams
                            ((Result *)local_2b0,pWVar15,local_230,local_238,&local_2d0,local_208,
                             &local_260);
                  local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_2b0;
                  std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2a8);
                  if (local_2a8._M_p != local_2a0 + 8) {
                    operator_delete(local_2a8._M_p,local_2a0._8_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_260._M_dataplus._M_p != &local_260.field_2) {
                    operator_delete(local_260._M_dataplus._M_p,
                                    local_260.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                    operator_delete(local_2d0._M_dataplus._M_p,
                                    local_2d0.field_2._M_allocated_capacity + 1);
                  }
                  bVar4 = Result::good((Result *)&local_288);
                  if (!bVar4) goto LAB_0051f015;
LAB_0051f5b9:
                  if (bVar2 != false) {
                    if (local_23c < QUINT) {
                      pWVar15 = (LVar6.convolution_)->bias_;
                      if (pWVar15 == (WeightParams *)0x0) {
                        pWVar15 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                      }
                      if (local_23c == FLOAT32) {
                        uVar12 = (unsigned_long)(pWVar15->floatvalue_).current_size_;
                      }
                      else {
                        uVar12 = ((pWVar15->float16value_).ptr_)->_M_string_length >> 1;
                      }
                      if (uVar12 != local_238) {
                        std::operator+(&local_178,"Convolution layer \'",(layer->name_).ptr_);
                        plVar10 = (long *)std::__cxx11::string::append((char *)&local_178);
                        psVar11 = (size_type *)(plVar10 + 2);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar10 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar11) {
                          local_228.field_2._M_allocated_capacity = *psVar11;
                          local_228.field_2._8_8_ = plVar10[3];
                          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                        }
                        else {
                          local_228.field_2._M_allocated_capacity = *psVar11;
                          local_228._M_dataplus._M_p = (pointer)*plVar10;
                        }
                        local_228._M_string_length = plVar10[1];
                        *plVar10 = (long)psVar11;
                        plVar10[1] = 0;
                        *(undefined1 *)(plVar10 + 2) = 0;
                        std::__cxx11::to_string(&local_200,uVar12);
                        std::operator+(&local_158,&local_228,&local_200);
                        plVar10 = (long *)std::__cxx11::string::append((char *)&local_158);
                        psVar11 = (size_type *)(plVar10 + 2);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar10 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar11) {
                          local_260.field_2._M_allocated_capacity = *psVar11;
                          local_260.field_2._8_8_ = plVar10[3];
                          local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                        }
                        else {
                          local_260.field_2._M_allocated_capacity = *psVar11;
                          local_260._M_dataplus._M_p = (pointer)*plVar10;
                        }
                        local_260._M_string_length = plVar10[1];
                        *plVar10 = (long)psVar11;
                        plVar10[1] = 0;
                        *(undefined1 *)(plVar10 + 2) = 0;
                        std::__cxx11::to_string(&local_198,local_238);
                        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_2b0,&local_260,&local_198);
                        puVar7 = (undefined8 *)std::__cxx11::string::append(local_2b0);
                        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                        psVar11 = puVar7 + 2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*puVar7 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar11) {
                          local_2d0.field_2._M_allocated_capacity = *psVar11;
                          local_2d0.field_2._8_8_ = puVar7[3];
                        }
                        else {
                          local_2d0.field_2._M_allocated_capacity = *psVar11;
                          local_2d0._M_dataplus._M_p = (pointer)*puVar7;
                        }
                        local_2d0._M_string_length = puVar7[1];
                        *puVar7 = psVar11;
                        puVar7[1] = 0;
                        *(undefined1 *)(puVar7 + 2) = 0;
                        if (local_2b0 != (undefined1  [8])local_2a0) {
                          operator_delete((void *)local_2b0,local_2a0._0_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_198._M_dataplus._M_p != &local_198.field_2) {
                          operator_delete(local_198._M_dataplus._M_p,
                                          local_198.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_260._M_dataplus._M_p != &local_260.field_2) {
                          operator_delete(local_260._M_dataplus._M_p,
                                          local_260.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_158._M_dataplus._M_p != &local_158.field_2) {
                          operator_delete(local_158._M_dataplus._M_p,
                                          local_158.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_200._M_dataplus._M_p != &local_200.field_2) {
                          operator_delete(local_200._M_dataplus._M_p,
                                          local_200.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_228._M_dataplus._M_p != &local_228.field_2) {
                          operator_delete(local_228._M_dataplus._M_p,
                                          local_228.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_178._M_dataplus._M_p != &local_178.field_2) {
                          operator_delete(local_178._M_dataplus._M_p,
                                          local_178.field_2._M_allocated_capacity + 1);
                        }
                        Result::Result((Result *)local_2b0,INVALID_MODEL_PARAMETERS,&local_2d0);
                        goto LAB_005206d8;
                      }
                    }
                    else {
                      if (local_23c != QUINT) {
                        std::operator+(&local_260,"Layer ",(layer->name_).ptr_);
                        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_260);
                        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                        psVar11 = puVar7 + 2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*puVar7 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar11) {
                          local_2d0.field_2._M_allocated_capacity = *psVar11;
                          local_2d0.field_2._8_8_ = puVar7[3];
                        }
                        else {
                          local_2d0.field_2._M_allocated_capacity = *psVar11;
                          local_2d0._M_dataplus._M_p = (pointer)*puVar7;
                        }
                        local_2d0._M_string_length = puVar7[1];
                        *puVar7 = psVar11;
                        puVar7[1] = 0;
                        *(undefined1 *)(puVar7 + 2) = 0;
                        Result::Result((Result *)local_2b0,INVALID_MODEL_PARAMETERS,&local_2d0);
                        goto LAB_0051f807;
                      }
                      pWVar15 = (LVar6.convolution_)->bias_;
                      if (pWVar15 == (WeightParams *)0x0) {
                        pWVar15 = (WeightParams *)&Specification::_WeightParams_default_instance_;
                      }
                      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_2d0,"Convolution","");
                      layerName = (layer->name_).ptr_;
                      local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_260,"bias","");
                      validateGeneralWeightParams
                                ((Result *)local_2b0,pWVar15,local_238,1,&local_2d0,layerName,
                                 &local_260);
                      local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_2b0;
                      std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2a8);
                      if (local_2a8._M_p != local_2a0 + 8) {
                        operator_delete(local_2a8._M_p,local_2a0._8_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_260._M_dataplus._M_p != &local_260.field_2) {
                        operator_delete(local_260._M_dataplus._M_p,
                                        local_260.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                        operator_delete(local_2d0._M_dataplus._M_p,
                                        local_2d0.field_2._M_allocated_capacity + 1);
                      }
                      Result::good((Result *)&local_288);
                    }
                  }
                  goto LAB_0051f015;
                }
                std::operator+(&local_260,"Layer ",(layer->name_).ptr_);
                puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_260);
                local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                psVar11 = puVar7 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar11) {
                  local_2d0.field_2._M_allocated_capacity = *psVar11;
                  local_2d0.field_2._8_8_ = puVar7[3];
                }
                else {
                  local_2d0.field_2._M_allocated_capacity = *psVar11;
                  local_2d0._M_dataplus._M_p = (pointer)*puVar7;
                }
                local_2d0._M_string_length = puVar7[1];
                *puVar7 = psVar11;
                puVar7[1] = 0;
                *(undefined1 *)(puVar7 + 2) = 0;
                Result::Result((Result *)local_2b0,INVALID_MODEL_PARAMETERS,&local_2d0);
              }
              else {
                std::operator+(&local_260,"Convolution layer ",(layer->name_).ptr_);
                puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_260);
                local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                psVar11 = puVar7 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar11) {
                  local_2d0.field_2._M_allocated_capacity = *psVar11;
                  local_2d0.field_2._8_8_ = puVar7[3];
                }
                else {
                  local_2d0.field_2._M_allocated_capacity = *psVar11;
                  local_2d0._M_dataplus._M_p = (pointer)*puVar7;
                }
                local_2d0._M_string_length = puVar7[1];
                *puVar7 = psVar11;
                puVar7[1] = 0;
                *(undefined1 *)(puVar7 + 2) = 0;
                Result::Result((Result *)local_2b0,INVALID_MODEL_PARAMETERS,&local_2d0);
              }
LAB_0051f807:
              local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2b0;
              std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2a8);
              if (local_2a8._M_p != local_2a0 + 8) {
                operator_delete(local_2a8._M_p,local_2a0._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                operator_delete(local_2d0._M_dataplus._M_p,
                                local_2d0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_260._M_dataplus._M_p != &local_260.field_2) {
                operator_delete(local_260._M_dataplus._M_p,
                                local_260.field_2._M_allocated_capacity + 1);
              }
              goto LAB_0051f015;
            }
            std::operator+(&local_2d0,"Deconvolution Layer \'",(layer->name_).ptr_);
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
            local_2b0 = (undefined1  [8])local_2a0;
            psVar11 = puVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_2a0._0_8_ = *psVar11;
              local_2a0._8_8_ = puVar7[3];
            }
            else {
              local_2a0._0_8_ = *psVar11;
              local_2b0 = (undefined1  [8])*puVar7;
            }
            local_2a8._M_p = (pointer)puVar7[1];
            *puVar7 = psVar11;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_2b0);
            goto LAB_0051ef48;
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2b0,"Padding type for convolution layer \'",(layer->name_).ptr_);
          puVar7 = (undefined8 *)std::__cxx11::string::append(local_2b0);
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
          psVar11 = puVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_2d0.field_2._M_allocated_capacity = *psVar11;
            local_2d0.field_2._8_8_ = puVar7[3];
          }
          else {
            local_2d0.field_2._M_allocated_capacity = *psVar11;
            local_2d0._M_dataplus._M_p = (pointer)*puVar7;
          }
          local_2d0._M_string_length = puVar7[1];
          *puVar7 = psVar11;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          if (local_2b0 != (undefined1  [8])local_2a0) {
            operator_delete((void *)local_2b0,local_2a0._0_8_ + 1);
          }
          Result::Result((Result *)local_2b0,INVALID_MODEL_PARAMETERS,&local_2d0);
LAB_0051ee66:
          local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2b0;
          std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2a8);
          if (local_2a8._M_p != local_2a0 + 8) {
            operator_delete(local_2a8._M_p,local_2a0._8_8_ + 1);
          }
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)__return_storage_ptr__ = local_288;
          paVar1 = &(__return_storage_ptr__->m_message).field_2;
          (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280._M_p == &local_270) {
            paVar1->_M_allocated_capacity =
                 CONCAT71(local_270._M_allocated_capacity._1_7_,local_270._M_local_buf[0]);
            *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) =
                 local_270._8_8_;
          }
          else {
            (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_280._M_p;
            (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
                 CONCAT71(local_270._M_allocated_capacity._1_7_,local_270._M_local_buf[0]);
          }
          (__return_storage_ptr__->m_message)._M_string_length = local_278;
          local_278 = 0;
          local_270._M_local_buf[0] = '\0';
          local_280._M_p = (pointer)&local_270;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p == &local_2d0.field_2) goto LAB_0051f063;
LAB_0051eef5:
          local_280._M_p = (pointer)&local_270;
          local_270._M_local_buf[0] = '\0';
          local_278 = 0;
          uVar13 = local_2d0.field_2._M_allocated_capacity;
          _Var14._M_p = local_2d0._M_dataplus._M_p;
        }
        else {
          std::operator+(&local_2d0,"Convolution Layer \'",(layer->name_).ptr_);
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_2d0);
          local_2b0 = (undefined1  [8])local_2a0;
          psVar11 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_2a0._0_8_ = *psVar11;
            local_2a0._8_8_ = plVar10[3];
          }
          else {
            local_2a0._0_8_ = *psVar11;
            local_2b0 = (undefined1  [8])*plVar10;
          }
          local_2a8._M_p = (pointer)plVar10[1];
          *plVar10 = (long)psVar11;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
            operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_2b0);
LAB_0051ef48:
          uVar13 = local_2a0._0_8_;
          _Var14._M_p = (pointer)local_2b0;
          if (local_2b0 == (undefined1  [8])local_2a0) goto LAB_0051f063;
        }
        operator_delete(_Var14._M_p,uVar13 + 1);
        goto LAB_0051f063;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Convolution","");
      validateInputOutputRankEquality((Result *)local_2b0,layer,&local_50,&this->blobNameToRank);
      local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b0;
      std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2a8);
      if (local_2a8._M_p != local_2a0 + 8) {
        operator_delete(local_2a8._M_p,local_2a0._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar4 = Result::good((Result *)&local_288);
      if (bVar4) {
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Convolution","");
        validateRankCount((Result *)local_2b0,layer,&local_2d0,4,-1,&this->blobNameToRank);
        local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0;
        std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2a8);
        if (local_2a8._M_p != local_2a0 + 8) {
          operator_delete(local_2a8._M_p,local_2a0._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
        }
        bVar4 = Result::good((Result *)&local_288);
        if (bVar4) goto LAB_0051ebec;
      }
    }
  }
LAB_0051f015:
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)__return_storage_ptr__ = local_288;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_p == &local_270) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_270._M_allocated_capacity._1_7_,local_270._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_270._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_280._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_270._M_allocated_capacity._1_7_,local_270._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_278;
  local_278 = 0;
  local_270._M_local_buf[0] = '\0';
  local_280._M_p = (pointer)&local_270;
LAB_0051f063:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_p != &local_270) {
    operator_delete(local_280._M_p,
                    CONCAT71(local_270._M_allocated_capacity._1_7_,local_270._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateConvolutionLayer(const Specification::NeuralNetworkLayer& layer) {

    Result r;
    r = validateInputCount(layer, 1, 2);
    if (!r.good()) {return r;}

    r = validateOutputCount(layer, 1, 1);
    if (!r.good()) {return r;}

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Convolution", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Convolution", 4, -1, blobNameToRank);
        if (!r.good()) {return r;}
    } else {
        if (layer.input_size() != 1) {
            std::string err = "Convolution Layer '" + layer.name() +
            "' does not support weight as input tensor when RANK5_ARRAY_MAPPING == true.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    // We need to check if the ConvolutionPaddingType is set
    if (layer.convolution().ConvolutionPaddingType_case() == Specification::ConvolutionLayerParams::ConvolutionPaddingTypeCase::CONVOLUTIONPADDINGTYPE_NOT_SET) {
        std::string err = "Padding type for convolution layer '" + layer.name() + "' is not set.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    const auto& params = layer.convolution();
    bool is_deconv = params.isdeconvolution();
    if (is_deconv && layer.input_size() != 1) {
        std::string err = "Deconvolution Layer '" + layer.name() + "' does not support weight as input tensor.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    if (layer.input_size() != 1 && (
        ((params.dilationfactor_size() > 0 && params.dilationfactor(0) > 1) ||
        (params.dilationfactor_size() > 1 && params.dilationfactor(1) > 1))
        )) {
        std::string err = "Convolution layer: '" + layer.name() + "' , dilated convolution does not support weight as input tensor.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    uint64_t kernelChannels = params.kernelchannels();
    uint64_t outputChannels = params.outputchannels();
    uint64_t nGroups = params.ngroups();
    if (nGroups == 0) {
        // default value specified in protobuf
        nGroups = 1;
    }
    uint64_t kernelHeight;
    if (params.kernelsize_size() > 0) {
        kernelHeight = params.kernelsize(0);
    }
    else {
        // this is the default specified in the protobuf file
        kernelHeight = 3;
    }
    uint64_t kernelWidth;
    if (params.kernelsize_size() > 1) {
        kernelWidth = params.kernelsize(1);
    }
    else {
        kernelWidth = 3;
    }

    if (layer.input_size() > 1) {
        return r;
    }

    bool has_bias = params.hasbias();
    if (has_bias && layer.input_size() != 1) {
        std::string err = "Convolution layer: '" + layer.name() + "' with dynamic weight does not support static bias.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    WeightParamType weightsValueType, biasValueType;
    weightsValueType = valueType(params.weights());
    biasValueType = valueType(params.bias());

    // Check weight/bias value types. Only float32 or float16 parameters can be populated at any time
    if ( (weightsValueType == UNSPECIFIED) || (has_bias && biasValueType == UNSPECIFIED)) {
        std::string err = "Convolution layer '" + layer.name() + "'  has invalid weights/bias fields.";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }
    if (has_bias){
        if ((weightsValueType == CoreML::FLOAT16 && biasValueType == CoreML::FLOAT32) ||
            (weightsValueType == CoreML::FLOAT32 && biasValueType == CoreML::FLOAT16)){
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Convolution layer " + layer.name() +
                       "has unmatched precisions of weights/bias They should either be half or full precision.");
            return r;
        }
    }

    // Get populated weight and bias sizes
    // Check weights
    uint64_t expected_weight_size = 0;
    // conv: outputChannels, kernelChannels, kernelHeight, kernelWidth
    // deconv: kernelChannels, outputChannels / nGroups, kernelHeight, kernelWidth
    if (is_deconv) {
        expected_weight_size = kernelChannels * (outputChannels / nGroups) * kernelHeight * kernelWidth;
    }
    else {
        expected_weight_size = outputChannels * kernelChannels * kernelHeight * kernelWidth;
    }
    uint64_t weight_size = 0;
    if (weightsValueType == FLOAT32 || weightsValueType == FLOAT16) {
        if (weightsValueType == FLOAT32) {
            weight_size = static_cast<uint64_t>(params.weights().floatvalue().size());
        } else {
            weight_size = static_cast<uint64_t>(params.weights().float16value().size() / 2);
        }
        if (weight_size != expected_weight_size) {
            if (is_deconv) {
                std::string err = "Deconvolution layer '" + layer.name() + "' has weight matrix of size " + std::to_string(weight_size) + " to encode a " + std::to_string(kernelChannels) + " × " + std::to_string(outputChannels/nGroups) + " × " + std::to_string(kernelHeight) + " × " + std::to_string(kernelWidth) + " convolution.";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
            else {
                std::string err = "Convolution layer '" + layer.name() + "' has weight matrix of size " + std::to_string(weight_size) + " to encode a " + std::to_string(outputChannels) + " × " + std::to_string(kernelChannels) + " × " + std::to_string(kernelHeight) + " × " + std::to_string(kernelWidth) + " convolution.";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
        }
    } // if (weightsValueType == FLOAT32 || weightsValueType == FLOAT16)
    else if (weightsValueType == QUINT) {
        r = validateGeneralWeightParams(params.weights(), expected_weight_size, outputChannels, "Convolution", layer.name(), "weight");
        if (!r.good()) return r;
    } else { // EMPTY
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer " + layer.name() + "has not specified weights.");
        return r;
    }

    // Check the bias
    uint64_t bias_size = 0;
    if (has_bias) {
        if (biasValueType == FLOAT32 || biasValueType == FLOAT16){
            if (biasValueType == FLOAT32){
                bias_size = static_cast<uint64_t>(params.bias().floatvalue().size());
            } else {
                bias_size = static_cast<uint64_t>(params.bias().float16value().size() / 2);
            }
            if (bias_size != outputChannels) {
                std::string err = "Convolution layer '" + layer.name() + "' has a bias vector of size " +
                std::to_string(bias_size) + " but should be " + std::to_string(outputChannels) + ".";
                r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                return r;
            }
        } else if (biasValueType == QUINT){
            // quantization of bias vector should be 1
            r = validateGeneralWeightParams(params.bias(), outputChannels, 1, "Convolution", layer.name(), "bias");
            if (!r.good()) return r;
        } else { // EMPTY
            r = Result(ResultType::INVALID_MODEL_PARAMETERS, "Layer " + layer.name() + "has not specified bias.");
            return r;
        }
    }
    return r;
}